

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_double<double>(BasicWriter<char> *this,double value,FormatSpec *spec)

{
  char cVar1;
  Alignment AVar2;
  bool bVar3;
  char cVar4;
  CharPtr pcVar5;
  byte *pbVar6;
  Buffer<char> *pBVar7;
  uint uVar8;
  char *pcVar9;
  char cVar10;
  size_t __len_1;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  Buffer<char> *pBVar14;
  size_t __len;
  ulong __n;
  Buffer<char> **ppBVar15;
  ulong __n_00;
  byte bVar16;
  char *pcVar17;
  bool bVar18;
  ulong in_XMM0_Qb;
  char format [10];
  uint local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar19;
  undefined4 in_stack_ffffffffffffffa4;
  wchar_t wVar20;
  char local_52 [10];
  double local_48;
  ulong uStack_40;
  
  bVar16 = spec->type_;
  uVar8 = bVar16 - 0x41;
  local_48 = value;
  if (uVar8 < 0x27) {
    if ((0x71UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_00129074;
      goto LAB_00128e22;
    }
    bVar3 = true;
  }
  else {
LAB_00129074:
    if (bVar16 != 0) {
      internal::report_unknown_type
                ((char)((ulong)spec >> 0x38),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    bVar16 = 0x67;
LAB_00128e22:
    bVar3 = false;
  }
  if (0.0 <= value) {
    uVar8 = spec->flags_;
    uVar19 = 0x2b;
    if ((uVar8 & 2) == 0) {
      uVar19 = 0x20;
    }
    cVar10 = (char)uVar19;
    if (NAN(value)) {
      if ((uVar8 & 1) == 0) {
        pcVar9 = " NAN";
        pcVar17 = " nan";
LAB_00128ebb:
        if (bVar3) {
          pcVar17 = pcVar9;
        }
        write_str<char>(this,pcVar17 + 1,3,&spec->super_AlignSpec);
        return;
      }
      pcVar9 = " NAN";
      pcVar17 = " nan";
      goto LAB_00128ef1;
    }
    if (ABS(value) == INFINITY) {
      if ((uVar8 & 1) == 0) {
        pcVar9 = " INF";
        pcVar17 = " inf";
        goto LAB_00128ebb;
      }
      goto LAB_00128ee3;
    }
    pBVar14 = this->buffer_;
    sVar11 = pBVar14->size_;
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    uStack_40 = in_XMM0_Qb;
    if ((uVar8 & 1) != 0) goto LAB_00128f3a;
    uVar19 = 0;
    bVar3 = true;
  }
  else {
    cVar10 = '-';
    if (value <= -INFINITY) {
LAB_00128ee3:
      pcVar9 = " INF";
      pcVar17 = " inf";
LAB_00128ef1:
      if (bVar3) {
        pcVar17 = pcVar9;
      }
      pcVar5 = write_str<char>(this,pcVar17,4,&spec->super_AlignSpec);
      *pcVar5 = cVar10;
      return;
    }
    local_48 = -value;
    uStack_40 = in_XMM0_Qb ^ 0x8000000000000000;
    pBVar14 = this->buffer_;
    sVar11 = pBVar14->size_;
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    uVar19 = 0x2d;
LAB_00128f3a:
    if (pBVar14->capacity_ < (uVar12 + (uVar12 == 0)) + sVar11) {
      (**pBVar14->_vptr_Buffer)();
    }
    bVar18 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    bVar3 = false;
    if (bVar18) {
      uVar12 = 0;
    }
    sVar11 = sVar11 + 1;
    uVar8 = spec->flags_;
  }
  ppBVar15 = &this->buffer_;
  local_52[0] = '%';
  if ((uVar8 & 8) == 0) {
    pbVar6 = (byte *)(local_52 + 1);
  }
  else {
    pbVar6 = (byte *)(local_52 + 2);
    local_52[1] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_00128fb3:
    uVar12 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *pbVar6 = 0x2d;
      pbVar6 = pbVar6 + 1;
    }
    if (uVar12 == 0) goto LAB_00128fb3;
    *pbVar6 = 0x2a;
    pbVar6 = pbVar6 + 1;
  }
  if (-1 < spec->precision_) {
    pbVar6[0] = 0x2e;
    pbVar6[1] = 0x2a;
    pbVar6 = pbVar6 + 2;
  }
  *pbVar6 = bVar16;
  pbVar6[1] = 0;
  wVar20 = (spec->super_AlignSpec).super_WidthSpec.fill_;
LAB_00128fe5:
  while( true ) {
    pcVar17 = (*ppBVar15)->ptr_ + sVar11;
    uVar8 = internal::CharTraits<char>::format_float<double>
                      (pcVar17,(*ppBVar15)->capacity_ - sVar11,local_52,uVar12,spec->precision_,
                       local_48);
    cVar10 = (char)uVar19;
    if ((int)uVar8 < 0) goto LAB_00129035;
    pBVar14 = *ppBVar15;
    if (uVar8 + sVar11 < pBVar14->capacity_) break;
    uVar13 = uVar8 + sVar11 + 1;
    if (pBVar14->capacity_ < uVar13) goto LAB_00129046;
  }
  if (bVar3) {
    cVar10 = '\0';
    goto LAB_001290a3;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    cVar1 = *pcVar17;
joined_r0x00129094:
    cVar4 = (char)wVar20;
    if (cVar1 != ' ') goto LAB_00129098;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      cVar1 = *pcVar17;
      goto joined_r0x00129094;
    }
LAB_00129098:
    cVar4 = cVar10;
    cVar10 = '\0';
  }
  pcVar17[-1] = cVar4;
  uVar8 = uVar8 + 1;
LAB_001290a3:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar8 < uVar12) {
      pBVar14 = *ppBVar15;
      sVar11 = pBVar14->size_;
      uVar13 = sVar11 + uVar12;
      pBVar7 = pBVar14;
      if (pBVar14->capacity_ < uVar13) {
        (**pBVar14->_vptr_Buffer)(pBVar14,uVar13);
        pBVar7 = *ppBVar15;
      }
      pBVar14->size_ = uVar13;
      pcVar17 = pBVar7->ptr_ + sVar11;
      __n_00 = (ulong)uVar8;
      memmove(pcVar17 + (uVar12 - uVar8 >> 1),pcVar17,__n_00);
      uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar13 = uVar12 - __n_00;
      __n = uVar13 >> 1;
      if (1 < uVar13) {
        local_68 = wVar20 & 0xff;
        memset(pcVar17,local_68,__n);
      }
      if (uVar12 == uVar8) {
        return;
      }
      memset(pcVar17 + __n_00 + __n,wVar20 & 0xff,uVar13 - __n);
      return;
    }
  }
  if ((cVar10 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    cVar1 = *pcVar17;
    while (cVar1 == ' ') {
      *pcVar17 = (char)wVar20;
      cVar1 = pcVar17[1];
      pcVar17 = pcVar17 + 1;
    }
    if (cVar10 != '\0') {
      pcVar17[-1] = cVar10;
    }
  }
  pBVar14 = *ppBVar15;
  uVar13 = (ulong)uVar8 + pBVar14->size_;
  if (pBVar14->capacity_ < uVar13) {
    (**pBVar14->_vptr_Buffer)(pBVar14,uVar13);
  }
  pBVar14->size_ = uVar13;
  return;
LAB_00129035:
  pBVar14 = *ppBVar15;
  if (pBVar14->capacity_ != 0xffffffffffffffff) {
    uVar13 = pBVar14->capacity_ + 1;
LAB_00129046:
    (**pBVar14->_vptr_Buffer)(pBVar14,uVar13);
  }
  goto LAB_00128fe5;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}